

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialogPrivate::emitUrlsSelected(QFileDialogPrivate *this,QList<QUrl> *files)

{
  QFileDialog *this_00;
  char cVar1;
  long lVar2;
  QUrl *file;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<QString> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialog **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  QFileDialog::urlsSelected(this_00,files);
  local_48.d = (Data *)0x0;
  local_48.ptr = (QString *)0x0;
  local_48.size = 0;
  for (lVar2 = (files->d).size << 3; lVar2 != 0; lVar2 = lVar2 + -8) {
    cVar1 = QUrl::isLocalFile();
    if (cVar1 != '\0') {
      QUrl::toLocalFile();
      QList<QString>::emplaceBack<QString>((QList<QString> *)&local_48,(QString *)&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    }
  }
  if (local_48.size != 0) {
    QFileDialog::filesSelected(this_00,(QStringList *)&local_48);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::emitUrlsSelected(const QList<QUrl> &files)
{
    Q_Q(QFileDialog);
    emit q->urlsSelected(files);
    QStringList localFiles;
    for (const QUrl &file : files)
        if (file.isLocalFile())
            localFiles.append(file.toLocalFile());
    if (!localFiles.isEmpty())
        emit q->filesSelected(localFiles);
}